

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banner.cpp
# Opt level: O0

wifstream * GetTitleAndDeveloperFromSpecCommandArgument(wifstream *stream,wstring *command_argument)

{
  runtime_error *this;
  wstring *in_RDX;
  wstring local_e8 [32];
  wstring local_c8 [8];
  wstring line;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int local_30;
  int local_2c;
  wchar_t first_char;
  int current_line;
  int max_lines;
  wstring *command_argument_local;
  wifstream *stream_local;
  wstring *title_and_developer;
  
  current_line._3_1_ = 0;
  command_argument_local = command_argument;
  stream_local = stream;
  std::__cxx11::wstring::wstring((wstring *)stream,in_RDX);
  first_char = L'\x03';
  local_2c = 1;
  while( true ) {
    local_30 = std::wistream::get();
    std::wistream::unget();
    if (local_30 != 0x20) {
      return stream;
    }
    if (local_2c == 3) break;
    local_2c = local_2c + 1;
    std::__cxx11::wstring::wstring(local_c8);
    std::getline<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
              ((wistream *)command_argument_local,local_c8);
    std::__cxx11::wstring::operator+=((wstring *)stream,L'\n');
    std::__cxx11::wstring::find_first_not_of((wchar_t)local_c8,0x20);
    std::__cxx11::wstring::size();
    std::__cxx11::wstring::substr((ulong)local_e8,(ulong)local_c8);
    std::__cxx11::wstring::operator+=((wstring *)stream,local_e8);
    std::__cxx11::wstring::~wstring(local_e8);
    std::__cxx11::wstring::~wstring(local_c8);
  }
  local_2c = local_2c + 1;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_a0,3);
  std::operator+(&local_80,"Title and developer can not be more than ",&local_a0);
  std::operator+(&local_60,&local_80," lines");
  std::runtime_error::runtime_error(this,(string *)&local_60);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::wstring GetTitleAndDeveloperFromSpecCommandArgument(std::wifstream& stream, const std::wstring& command_argument) {
    std::wstring title_and_developer = command_argument;
    constexpr int max_lines = 3;
    int current_line = 1;

    while (true) {
        wchar_t first_char = stream.get();
        stream.unget();
        if (first_char != L' ') {
            return title_and_developer;
        }

        if (current_line++ == max_lines) {
            throw std::runtime_error("Title and developer can not be more than " + std::to_string(max_lines) + " lines");
        }

        std::wstring line;
        std::getline(stream, line);

        title_and_developer += '\n';
        title_and_developer += line.substr(line.find_first_not_of(L' '), line.size());
    }
}